

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O2

Gia_Man_t * Gia_ManDupWithArtificalFaddBoxesTest(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  Gia_Man_t *pGVar2;
  uint uVar3;
  ulong uVar4;
  uint v;
  ulong uVar5;
  int iVar6;
  
  Gia_ManCleanMark01(p);
  iVar6 = 0;
  v = 0;
  while( true ) {
    if (p->nObjs <= (int)v) break;
    pGVar1 = Gia_ManObj(p,v);
    if (pGVar1 == (Gia_Obj_t *)0x0) break;
    uVar3 = (uint)*(ulong *)pGVar1;
    if ((~uVar3 & 0x1fffffff) != 0 && -1 < (int)uVar3) {
      uVar3 = iVar6 + (v / 5) * -0x40000000 & 0x40000000;
      uVar5 = (ulong)((uint)((ulong)v % 7) & 1) << 0x3e | (ulong)uVar3;
      uVar4 = 0;
      if (uVar3 == 0) {
        uVar4 = uVar5;
      }
      if (((ulong)v % 7 & 1) == 0) {
        uVar4 = uVar5;
      }
      *(ulong *)pGVar1 = uVar4 | *(ulong *)pGVar1 & 0xbfffffff3fffffff;
    }
    v = v + 1;
    iVar6 = iVar6 + 0x40000000;
  }
  pGVar2 = Gia_ManDupWithArtificalFaddBoxes(p,0,0);
  Gia_ManCleanMark01(p);
  return pGVar2;
}

Assistant:

Gia_Man_t * Gia_ManDupWithArtificalFaddBoxesTest( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    // label some and-gates
    Gia_ManCleanMark01( p );
    Gia_ManForEachAnd( p, pObj, i )
    {
        pObj->fMark0 = i % 5;
        pObj->fMark1 = i % 7;
        if ( pObj->fMark0 && pObj->fMark1 )
            pObj->fMark0 = pObj->fMark1 = 0;
    }

    // output new AIG
    pNew = Gia_ManDupWithArtificalFaddBoxes( p, 0, 0 );
    Gia_ManCleanMark01( p );
    return pNew;
}